

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::updateRemovedColumns(QSpanCollection *this,int start,int end)

{
  const_iterator __position;
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  int *piVar4;
  int in_EDX;
  int in_ESI;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  int y;
  int delta;
  iterator it_y;
  Span *span;
  iterator it;
  SpanList toBeDeleted;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff68
  ;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  undefined4 in_stack_ffffffffffffff80;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *plVar6;
  const_iterator in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  _List_const_iterator<QSpanCollection::Span_*> local_48;
  _List_node_base *local_40;
  Span *local_38;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = in_RDI;
  bVar1 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          empty(in_RDI);
  if (!bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)0x8b1cf7);
    iVar2 = (in_EDX - in_ESI) + 1;
    local_28._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
         begin(in_RDI);
    while( true ) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
           end(in_RDI);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      ppSVar3 = std::_List_iterator<QSpanCollection::Span_*>::operator*
                          ((_List_iterator<QSpanCollection::Span_*> *)0x8b1d52);
      local_38 = *ppSVar3;
      if (local_38->m_right < in_ESI) {
        std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_28);
      }
      else {
        if (local_38->m_left < in_ESI) {
          if (in_EDX < local_38->m_right) {
            local_38->m_right = local_38->m_right - iVar2;
          }
          else {
            local_38->m_right = in_ESI + -1;
          }
        }
        else if (in_EDX < local_38->m_right) {
          if (in_EDX < local_38->m_left) {
            local_38->m_left = local_38->m_left - iVar2;
          }
          else {
            local_38->m_left = in_ESI;
          }
          local_38->m_right = local_38->m_right - iVar2;
        }
        else {
          local_38->will_be_deleted = true;
        }
        if ((local_38->m_top == local_38->m_bottom) && (local_38->m_left == local_38->m_right)) {
          local_38->will_be_deleted = true;
        }
        if ((local_38->will_be_deleted & 1U) == 0) {
          std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_28);
        }
        else {
          std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          push_back((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                    CONCAT44(iVar2,in_stack_ffffffffffffff80),
                    (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          std::_List_const_iterator<QSpanCollection::Span_*>::_List_const_iterator
                    (&local_48,&local_28);
          __position._M_node._4_4_ = iVar2;
          __position._M_node._0_4_ = in_stack_ffffffffffffff80;
          local_40 = (_List_node_base *)
                     std::__cxx11::
                     list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::erase
                               ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                __position);
          local_28._M_node = local_40;
        }
      }
    }
    bVar1 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
            empty(in_RDI);
    if (bVar1) {
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                (in_RDI);
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear
                ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_RDI);
    }
    else {
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
                ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffff80));
      while( true ) {
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                  ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffff80));
        bVar1 = ::operator!=((iterator *)in_RDI,(iterator *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        piVar4 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b1f1a)
        ;
        iVar5 = -*piVar4;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value((iterator *)0x8b1f2f);
        bVar1 = cleanSpanSubIndex((QSpanCollection *)in_stack_ffffffffffffffa0._M_node,
                                  (SubIndex *)in_stack_ffffffffffffff98._M_node,
                                  (int)((ulong)plVar6 >> 0x20),SUB81((ulong)plVar6 >> 0x18,0));
        if (bVar1) {
          in_stack_ffffffffffffff68 = in_RDI + 1;
          QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                    ((const_iterator *)in_RDI,(iterator *)in_stack_ffffffffffffff68);
          in_stack_ffffffffffffffa0._M_node =
               (_Base_ptr)
               QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                         ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)
                          CONCAT44(iVar5,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff98._M_node);
        }
        else {
          QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator++((iterator *)in_RDI);
        }
      }
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                (in_RDI);
    }
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::~list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)0x8b1fb1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateRemovedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList toBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start) {
            ++it;
            continue;
        }
        if (span->m_left < start) {
            if (span->m_right <= end)
                span->m_right = start - 1;
            else
                span->m_right -= delta;
        } else {
            if (span->m_right > end) {
                if (span->m_left <= end)
                    span->m_left = start;
                else
                    span->m_left -= delta;
                span->m_right -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            toBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(toBeDeleted);
        index.clear();
        return;
    }

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (cleanSpanSubIndex(it_y.value(), y, true))
            it_y = index.erase(it_y);
        else
            ++it_y;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << toBeDeleted;
#endif
    qDeleteAll(toBeDeleted);
}